

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall const::$_0::operator()(wasm::Type)::HeapType__(void *this,HeapType *heapType)

{
  bool bVar1;
  BasicHeapType BVar2;
  size_t sVar3;
  reference pTVar4;
  optional<wasm::HeapType> oVar5;
  bool local_b9;
  FeatureSet local_a8 [4];
  Type local_98;
  Type child;
  iterator __end4;
  iterator __begin4;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *__range4;
  undefined1 local_58 [8];
  Signature sig;
  _Storage<wasm::HeapType,_true> local_40;
  undefined1 local_38;
  RecGroup local_30;
  FeatureSet local_28;
  FeatureSet local_24;
  FeatureSet local_20;
  FeatureSet local_1c;
  HeapType *local_18;
  HeapType *heapType_local;
  ReferenceFeatureCollector *this_local;
  
  local_18 = heapType;
  heapType_local = (HeapType *)this;
  bVar1 = ::wasm::HeapType::isBasic(heapType);
  if (bVar1) {
    BVar2 = ::wasm::HeapType::getBasic(local_18);
    switch(BVar2) {
    case ext:
    case func:
      ::wasm::FeatureSet::FeatureSet(&local_1c,0x100);
      ::wasm::FeatureSet::operator|=((FeatureSet *)((long)this + 0x54),&local_1c);
      break;
    case any:
    case eq:
    case i31:
    case struct_:
    case array:
      ::wasm::FeatureSet::FeatureSet(&local_20,0x500);
      ::wasm::FeatureSet::operator|=((FeatureSet *)((long)this + 0x54),&local_20);
      break;
    case string:
    case stringview_wtf8:
    case stringview_wtf16:
    case stringview_iter:
      ::wasm::FeatureSet::FeatureSet(&local_24,0x8100);
      ::wasm::FeatureSet::operator|=((FeatureSet *)((long)this + 0x54),&local_24);
      break;
    case none:
    case noext:
    case nofunc:
      ::wasm::FeatureSet::FeatureSet(&local_28,0x100);
      ::wasm::FeatureSet::operator|=((FeatureSet *)((long)this + 0x54),&local_28);
      break;
    default:
      goto switchD_01cb41a0_default;
    }
  }
  else {
switchD_01cb41a0_default:
    bVar1 = ::wasm::HeapType::isStruct(local_18);
    local_b9 = true;
    if (!bVar1) {
      bVar1 = ::wasm::HeapType::isArray(local_18);
      local_b9 = true;
      if (!bVar1) {
        local_30 = ::wasm::HeapType::getRecGroup(local_18);
        sVar3 = ::wasm::RecGroup::size(&local_30);
        local_b9 = true;
        if (sVar3 < 2) {
          oVar5 = ::wasm::HeapType::getSuperType(local_18);
          local_40 = oVar5.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::HeapType>._M_payload;
          local_38 = oVar5.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::HeapType>._M_engaged;
          local_b9 = std::optional::operator_cast_to_bool((optional *)&local_40._M_value);
        }
      }
    }
    if (local_b9 == false) {
      bVar1 = ::wasm::HeapType::isSignature(local_18);
      if (bVar1) {
        ::wasm::FeatureSet::FeatureSet((FeatureSet *)&sig.results,0x100);
        ::wasm::FeatureSet::operator|=((FeatureSet *)((long)this + 0x54),(FeatureSet *)&sig.results)
        ;
        _local_58 = ::wasm::HeapType::getSignature(local_18);
        bVar1 = ::wasm::Type::isTuple(&sig.params);
        if (bVar1) {
          ::wasm::FeatureSet::FeatureSet((FeatureSet *)((long)&__range4 + 4),0x200);
          ::wasm::FeatureSet::operator|=
                    ((FeatureSet *)((long)this + 0x54),(FeatureSet *)((long)&__range4 + 4));
        }
      }
    }
    else {
      ::wasm::FeatureSet::FeatureSet((FeatureSet *)((long)&sig.results.id + 4),0x500);
      ::wasm::FeatureSet::operator|=
                ((FeatureSet *)((long)this + 0x54),(FeatureSet *)((long)&sig.results.id + 4));
    }
    ::wasm::HeapType::getTypeChildren
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__begin4,local_18);
    __end4 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin
                       ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__begin4);
    child.id = (uintptr_t)
               std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end
                         ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__begin4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                                       *)&child), bVar1) {
      pTVar4 = __gnu_cxx::
               __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
               ::operator*(&__end4);
      local_98.id = pTVar4->id;
      bVar1 = ::wasm::Type::isRef(&local_98);
      if (!bVar1) {
        local_a8[0] = ::wasm::Type::getFeatures(&local_98);
        ::wasm::FeatureSet::operator|=((FeatureSet *)((long)this + 0x54),local_a8);
      }
      __gnu_cxx::
      __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::
      operator++(&__end4);
    }
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__begin4);
  }
  return;
}

Assistant:

void noteChild(HeapType* heapType) {
          if (heapType->isBasic()) {
            switch (heapType->getBasic()) {
              case HeapType::ext:
              case HeapType::func:
                feats |= FeatureSet::ReferenceTypes;
                return;
              case HeapType::any:
              case HeapType::eq:
              case HeapType::i31:
              case HeapType::struct_:
              case HeapType::array:
                feats |= FeatureSet::ReferenceTypes | FeatureSet::GC;
                return;
              case HeapType::string:
              case HeapType::stringview_wtf8:
              case HeapType::stringview_wtf16:
              case HeapType::stringview_iter:
                feats |= FeatureSet::ReferenceTypes | FeatureSet::Strings;
                return;
              case HeapType::none:
              case HeapType::noext:
              case HeapType::nofunc:
                // Technically introduced in GC, but used internally as part of
                // ref.null with just reference types.
                feats |= FeatureSet::ReferenceTypes;
                return;
            }
          }

          if (heapType->isStruct() || heapType->isArray() ||
              heapType->getRecGroup().size() > 1 || heapType->getSuperType()) {
            feats |= FeatureSet::ReferenceTypes | FeatureSet::GC;
          } else if (heapType->isSignature()) {
            // This is a function reference, which requires reference types and
            // possibly also multivalue (if it has multiple returns). Note that
            // technically typed function references also require GC, however,
            // we use these types internally regardless of the presence of GC
            // (in particular, since during load of the wasm we don't know the
            // features yet, so we apply the more refined types), so we don't
            // add that in any case here.
            feats |= FeatureSet::ReferenceTypes;
            auto sig = heapType->getSignature();
            if (sig.results.isTuple()) {
              feats |= FeatureSet::Multivalue;
            }
          }

          // In addition, scan their non-ref children, to add dependencies on
          // things like SIMD.
          for (auto child : heapType->getTypeChildren()) {
            if (!child.isRef()) {
              feats |= child.getFeatures();
            }
          }
        }